

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O3

void ntru_session_hash(uint8_t *out,uint ok,uint16_t *plaintext,uint p,ptrlen ciphertext,
                      ptrlen confirmation_hash)

{
  ssh_hash *psVar1;
  ssh_hash *psVar2;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  
  psVar1 = sha512_select(&ssh_sha512);
  if (psVar1 != (ssh_hash *)0x0) {
    (*psVar1->vt->reset)(psVar1);
  }
  BinarySink_put_byte(psVar1->binarysink_,(uchar)ok);
  psVar2 = sha512_select(&ssh_sha512);
  if (psVar2 != (ssh_hash *)0x0) {
    (*psVar2->vt->reset)(psVar2);
  }
  BinarySink_put_byte(psVar2->binarysink_,'\x03');
  ntru_encode_plaintext(plaintext,p,psVar2->binarysink_);
  (*psVar2->vt->digest)(psVar2,(uchar *)&local_78);
  (*psVar2->vt->free)(psVar2);
  BinarySink_put_data(psVar1->binarysink_,&local_78,0x20);
  BinarySink_put_datapl(psVar1->binarysink_,ciphertext);
  BinarySink_put_datapl(psVar1->binarysink_,confirmation_hash);
  (*psVar1->vt->digest)(psVar1,(uchar *)&local_78);
  (*psVar1->vt->free)(psVar1);
  *(undefined8 *)(out + 0x10) = local_68;
  *(undefined8 *)(out + 0x18) = uStack_60;
  *(undefined8 *)out = local_78;
  *(undefined8 *)(out + 8) = uStack_70;
  smemclr(&local_78,0x40);
  return;
}

Assistant:

void ntru_session_hash(uint8_t *out, unsigned ok, const uint16_t *plaintext,
                       unsigned p, ptrlen ciphertext, ptrlen confirmation_hash)
{
    /* The outer hash object */
    ssh_hash *hsession = ssh_hash_new(&ssh_sha512);
    put_byte(hsession, ok);            /* initial byte 1 or 0 */

    uint8_t hashdata[64];

    /* Compute H(3 || r), or maybe H(3 || rho), and add it to the main hash */
    ssh_hash *h3r = ssh_hash_new(&ssh_sha512);
    put_byte(h3r, 3);
    ntru_encode_plaintext(plaintext, p, BinarySink_UPCAST(h3r));
    ssh_hash_final(h3r, hashdata);
    put_data(hsession, hashdata, 32);

    /* Put the ciphertext and confirmation hash in */
    put_datapl(hsession, ciphertext);
    put_datapl(hsession, confirmation_hash);

    /* Compute the full output of the main SHA-512 hash */
    ssh_hash_final(hsession, hashdata);

    /* And copy the first 32 bytes into the caller's output array */
    memcpy(out, hashdata, 32);
    smemclr(hashdata, sizeof(hashdata));
}